

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateActivationParams(Result *__return_storage_ptr__,ActivationParams *params)

{
  NonlinearityTypeCase NVar1;
  WeightParamType WVar2;
  WeightParamType WVar3;
  MLActivationParamsNonlinearityType MVar4;
  ActivationPReLU *this;
  ActivationParametricSoftplus *pAVar5;
  WeightParams *pWVar6;
  char *pcVar7;
  string local_520;
  stringstream local_500 [8];
  stringstream ss_2;
  ostream local_4f0 [376];
  string local_378;
  stringstream local_358 [8];
  stringstream ss_1;
  ostream local_348 [376];
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  ActivationParams *local_18;
  ActivationParams *params_local;
  
  local_18 = params;
  params_local = (ActivationParams *)__return_storage_ptr__;
  NVar1 = Specification::ActivationParams::NonlinearityType_case(params);
  switch(NVar1) {
  case kLinear:
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_500);
    std::operator<<(local_4f0,"Nonlinearity type ");
    MVar4 = Specification::ActivationParams::NonlinearityType_case(local_18);
    pcVar7 = MLActivationParamsNonlinearityType_Name(MVar4);
    std::operator<<(local_4f0,pcVar7);
    std::operator<<(local_4f0," is not supported in this version of CoreML.");
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::stringstream::~stringstream(local_500);
    return __return_storage_ptr__;
  case kReLU:
    break;
  case kLeakyReLU:
    break;
  case kThresholdedReLU:
    break;
  case kPReLU:
    this = Specification::ActivationParams::prelu(local_18);
    pWVar6 = Specification::ActivationPReLU::alpha(this);
    WVar2 = valueType(pWVar6);
    if (WVar2 == UNSPECIFIED) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::operator<<(local_190,"Nonlinearity type ");
      MVar4 = Specification::ActivationParams::NonlinearityType_case(local_18);
      pcVar7 = MLActivationParamsNonlinearityType_Name(MVar4);
      std::operator<<(local_190,pcVar7);
      std::operator<<(local_190," has inconsistent weight parameter types.");
      std::__cxx11::stringstream::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return __return_storage_ptr__;
    }
    break;
  case kTanh:
    break;
  case kScaledTanh:
    break;
  case kSigmoid:
    break;
  case kSigmoidHard:
    break;
  case kELU:
    break;
  case kSoftsign:
    break;
  case kSoftplus:
    break;
  case kParametricSoftplus:
    pAVar5 = Specification::ActivationParams::parametricsoftplus(local_18);
    pWVar6 = Specification::ActivationParametricSoftplus::alpha(pAVar5);
    WVar2 = valueType(pWVar6);
    pAVar5 = Specification::ActivationParams::parametricsoftplus(local_18);
    pWVar6 = Specification::ActivationParametricSoftplus::beta(pAVar5);
    WVar3 = valueType(pWVar6);
    if (WVar2 == WVar3) {
      pAVar5 = Specification::ActivationParams::parametricsoftplus(local_18);
      pWVar6 = Specification::ActivationParametricSoftplus::alpha(pAVar5);
      WVar2 = valueType(pWVar6);
      if (WVar2 != UNSPECIFIED) {
        pAVar5 = Specification::ActivationParams::parametricsoftplus(local_18);
        pWVar6 = Specification::ActivationParametricSoftplus::beta(pAVar5);
        WVar2 = valueType(pWVar6);
        if (WVar2 != UNSPECIFIED) break;
      }
    }
    std::__cxx11::stringstream::stringstream(local_358);
    std::operator<<(local_348,"Nonlinearity type ");
    MVar4 = Specification::ActivationParams::NonlinearityType_case(local_18);
    pcVar7 = MLActivationParamsNonlinearityType_Name(MVar4);
    std::operator<<(local_348,pcVar7);
    std::operator<<(local_348," has inconsistent weight parameter types.");
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::stringstream::~stringstream(local_358);
    return __return_storage_ptr__;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for non-recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLeakyReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kELU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftplus:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kPReLU:
        {
            if (valueType(params.prelu().alpha()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus:
        {
            if (valueType(params.parametricsoftplus().alpha()) != valueType(params.parametricsoftplus().beta()) ||
                valueType(params.parametricsoftplus().alpha()) == UNSPECIFIED ||
                valueType(params.parametricsoftplus().beta()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kThresholdedReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftsign:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Nonlinearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}